

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

Result<void> * __thiscall
ChainstateManager::PopulateAndValidateSnapshot
          (Result<void> *__return_storage_ptr__,ChainstateManager *this,
          Chainstate *snapshot_chainstate,AutoFile *coins_file,SnapshotMetadata *metadata)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  CChainParams *pCVar4;
  pointer pAVar5;
  string_view source_file;
  string_view source_file_00;
  bool bVar6;
  CoinsCacheSizeState CVar7;
  CCoinsViewCache *this_00;
  CBlockIndex *pCVar8;
  Chainstate *pCVar9;
  Logger *pLVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  size_t sVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar14;
  pointer __nbytes;
  pointer pAVar15;
  undefined8 *puVar16;
  long *plVar17;
  SnapshotMetadata *args_1;
  unsigned_long *in_R9;
  long in_FS_OFFSET;
  byte bVar18;
  string_view str;
  string_view str_00;
  Span<unsigned_char> bytes;
  string_view logging_function;
  string_view logging_function_00;
  int64_t coins_processed;
  uint64_t coins_left;
  uint64_t coins_count;
  int base_height;
  CBlockIndex *snapshot_start_block;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock56;
  optional<kernel::CCoinsStats> maybe_stats;
  CBlockIndex *index;
  Txid txid;
  uint256 base_blockhash;
  uint8_t obj;
  ulong local_828;
  float local_81c;
  long local_818;
  uint64_t local_810;
  uint64_t local_808;
  int local_7fc;
  CBlockIndex *local_7f8;
  undefined1 local_6a0 [8];
  undefined1 auStack_698 [32];
  uint local_678;
  undefined1 local_5c8 [32];
  _Alloc_hider local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598 [11];
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  bilingual_str local_4c8 [2];
  long *local_428;
  long local_420;
  long local_418 [2];
  undefined1 *local_408;
  undefined8 local_400;
  undefined1 local_3f8;
  undefined7 uStack_3f7;
  undefined8 uStack_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  undefined8 uStack_3d0;
  long *local_3c8;
  long local_3c0;
  long local_3b8 [2];
  bilingual_str local_3a8;
  long *local_368;
  long local_360;
  long local_358 [2];
  bilingual_str local_348;
  COutPoint local_308;
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  undefined8 uStack_280;
  uchar local_278 [40];
  long *local_250;
  long local_248;
  long local_240 [2];
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  undefined8 uStack_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200;
  undefined7 uStack_1ff;
  undefined8 uStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  bilingual_str local_1d0;
  undefined8 local_190 [10];
  char local_140;
  long *local_138;
  long local_130;
  long local_128 [2];
  bilingual_str local_118;
  uint256 local_d8 [2];
  string local_98;
  Wrapper<ScriptCompression,_CScript_&> local_78 [4];
  string local_58;
  long local_38;
  
  bVar18 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_5c8._0_8_ = &cs_main;
  local_5c8._8_8_ = local_5c8._8_8_ & 0xffffffffffffff00;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)coins_file;
  args_1 = metadata;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_5c8);
  this_00 = Chainstate::CoinsTip(snapshot_chainstate);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_5c8);
  local_d8[0].super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems;
  local_d8[0].super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  local_d8[0].super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x10);
  local_d8[0].super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  local_5c8._0_8_ = &cs_main;
  local_5c8._8_8_ = local_5c8._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_5c8);
  pCVar8 = ::node::BlockManager::LookupBlockIndex(&this->m_blockman,local_d8);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_5c8);
  local_7f8 = pCVar8;
  if (pCVar8 == (CBlockIndex *)0x0) {
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"Did not find snapshot start blockheader %s","");
    local_5c8._0_8_ = (mutex_type *)(local_5c8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_5c8,local_138,local_130 + (long)local_138);
    local_5a8._M_p = (pointer)local_598;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,local_138,local_130 + (long)local_138);
    base_blob<256u>::ToString_abi_cxx11_((string *)local_6a0,local_d8);
    tinyformat::format<std::__cxx11::string>
              (&local_118,(tinyformat *)local_5c8,(bilingual_str *)local_6a0,args);
    puVar16 = (undefined8 *)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar16;
    paVar1 = &local_118.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.original._M_dataplus._M_p == paVar1) {
      *puVar16 = CONCAT71(local_118.original.field_2._M_allocated_capacity._1_7_,
                          local_118.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
           local_118.original.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> =
           local_118.original._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
           CONCAT71(local_118.original.field_2._M_allocated_capacity._1_7_,
                    local_118.original.field_2._M_local_buf[0]);
    }
    paVar2 = &local_118.translated.field_2;
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
         local_118.original._M_string_length;
    puVar16 = (undefined8 *)
              ((long)&(__return_storage_ptr__->m_variant).
                      super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                      super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.translated._M_dataplus._M_p == paVar2) {
      *puVar16 = CONCAT71(local_118.translated.field_2._M_allocated_capacity._1_7_,
                          local_118.translated.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
           local_118.translated.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
           local_118.translated._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
           CONCAT71(local_118.translated.field_2._M_allocated_capacity._1_7_,
                    local_118.translated.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
         local_118.translated._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
    local_118.translated.field_2._M_local_buf[0] = '\0';
    local_118.translated._M_string_length = 0;
    local_118.original.field_2._M_local_buf[0] = '\0';
    local_118.original._M_string_length = 0;
    local_118.original._M_dataplus._M_p = (pointer)paVar1;
    local_118.translated._M_dataplus._M_p = (pointer)paVar2;
    if (local_6a0 != (undefined1  [8])(auStack_698 + 8)) {
      operator_delete((void *)local_6a0,auStack_698._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_p != local_598) {
      operator_delete(local_5a8._M_p,local_598[0]._M_allocated_capacity + 1);
    }
    if ((mutex_type *)local_5c8._0_8_ != (mutex_type *)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
    }
    plVar17 = local_138;
    if (local_138 == local_128) goto LAB_00b21803;
  }
  else {
    local_7fc = pCVar8->nHeight;
    pCVar4 = (this->m_options).chainparams;
    pAVar15 = (pCVar4->m_assumeutxo_data).
              super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar5 = (pCVar4->m_assumeutxo_data).
             super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pAVar15 == pAVar5) {
LAB_00b208fb:
      local_140 = '\0';
    }
    else {
      iVar3 = pAVar15->height;
      while (iVar3 != local_7fc) {
        pAVar15 = pAVar15 + 1;
        if (pAVar15 == pAVar5) goto LAB_00b208fb;
        iVar3 = pAVar15->height;
      }
      puVar16 = local_190;
      for (lVar14 = 10; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar16 = *(undefined8 *)pAVar15;
        pAVar15 = (pointer)((long)pAVar15 + ((ulong)bVar18 * -4 + 2) * 4);
        puVar16 = puVar16 + (ulong)bVar18 * -2 + 1;
      }
      local_140 = '\x01';
    }
    if (local_140 == '\0') {
      local_1f0 = local_1e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,
                 "Assumeutxo height in snapshot metadata not recognized (%d) - refusing to load snapshot"
                 ,"");
      local_5c8._0_8_ = (mutex_type *)(local_5c8 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5c8,local_1f0,local_1e8 + (long)local_1f0);
      local_5a8._M_p = (pointer)local_598;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5a8,local_1f0,local_1e8 + (long)local_1f0);
      tinyformat::format<int>(&local_1d0,(bilingual_str *)local_5c8,&local_7fc);
      puVar16 = (undefined8 *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar16;
      paVar1 = &local_1d0.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.original._M_dataplus._M_p == paVar1) {
        *puVar16 = CONCAT71(local_1d0.original.field_2._M_allocated_capacity._1_7_,
                            local_1d0.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
             local_1d0.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> =
             local_1d0.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
             CONCAT71(local_1d0.original.field_2._M_allocated_capacity._1_7_,
                      local_1d0.original.field_2._M_local_buf[0]);
      }
      paVar2 = &local_1d0.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
           local_1d0.original._M_string_length;
      puVar16 = (undefined8 *)
                ((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar16;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.translated._M_dataplus._M_p == paVar2) {
        *puVar16 = CONCAT71(local_1d0.translated.field_2._M_allocated_capacity._1_7_,
                            local_1d0.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
             local_1d0.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
             local_1d0.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
             CONCAT71(local_1d0.translated.field_2._M_allocated_capacity._1_7_,
                      local_1d0.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
           local_1d0.translated._M_string_length;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
      local_1d0.translated.field_2._M_local_buf[0] = '\0';
      local_1d0.translated._M_string_length = 0;
      local_1d0.original.field_2._M_local_buf[0] = '\0';
      local_1d0.original._M_string_length = 0;
      local_1d0.original._M_dataplus._M_p = (pointer)paVar1;
      local_1d0.translated._M_dataplus._M_p = (pointer)paVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_p != local_598) {
        operator_delete(local_5a8._M_p,local_598[0]._M_allocated_capacity + 1);
      }
      if ((mutex_type *)local_5c8._0_8_ != (mutex_type *)(local_5c8 + 0x10)) {
        operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
      }
      local_128[0] = local_1e0[0];
      plVar17 = local_1f0;
      if (local_1f0 == local_1e0) goto LAB_00b21803;
    }
    else {
      local_5c8._0_8_ = &cs_main;
      local_5c8._8_8_ = local_5c8._8_8_ & 0xffffffffffffff00;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_5c8);
      pCVar9 = ActiveChainstate(this);
      __nbytes = (pCVar9->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (__nbytes ==
          (pCVar9->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pCVar8 = (CBlockIndex *)0x0;
      }
      else {
        pCVar8 = __nbytes[-1];
      }
      bVar6 = ::node::CBlockIndexWorkComparator::operator()
                        ((CBlockIndexWorkComparator *)local_6a0,pCVar8,local_7f8);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_5c8);
      if (bVar6) {
        local_810 = metadata->m_coins_count;
        local_808 = local_810;
        base_blob<256u>::ToString_abi_cxx11_(&local_98,local_d8);
        pLVar10 = LogInstance();
        bVar6 = BCLog::Logger::Enabled(pLVar10);
        if (bVar6) {
          local_5c8._8_8_ = 0;
          local_5c8._16_8_ = local_5c8._16_8_ & 0xffffffffffffff00;
          local_5c8._0_8_ = (mutex_type *)(local_5c8 + 0x10);
          tinyformat::format<unsigned_long,std::__cxx11::string>
                    ((string *)local_6a0,
                     (tinyformat *)"[snapshot] loading %d coins from snapshot %s\n",
                     (char *)&local_810,(unsigned_long *)&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0)
          ;
          if (local_6a0 != (undefined1  [8])(auStack_698 + 8)) {
            operator_delete((void *)local_6a0,auStack_698._8_8_ + 1);
          }
          pLVar10 = LogInstance();
          local_6a0 = (undefined1  [8])0x57;
          auStack_698._0_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          in_R9 = (unsigned_long *)0x16f5;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
          ;
          source_file_00._M_len = 0x57;
          str_00._M_str = (char *)local_5c8._0_8_;
          str_00._M_len = local_5c8._8_8_;
          logging_function_00._M_str = "PopulateAndValidateSnapshot";
          logging_function_00._M_len = 0x1b;
          __nbytes = (pointer)0x1b;
          BCLog::Logger::LogPrintStr
                    (pLVar10,str_00,logging_function_00,source_file_00,0x16f5,ALL,Info);
          if ((mutex_type *)local_5c8._0_8_ != (mutex_type *)(local_5c8 + 0x10)) {
            operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        local_818 = 0;
        while (local_810 != 0) {
          local_278[0x10] = '\0';
          local_278[0x11] = '\0';
          local_278[0x12] = '\0';
          local_278[0x13] = '\0';
          local_278[0x14] = '\0';
          local_278[0x15] = '\0';
          local_278[0x16] = '\0';
          local_278[0x17] = '\0';
          local_278[0x18] = '\0';
          local_278[0x19] = '\0';
          local_278[0x1a] = '\0';
          local_278[0x1b] = '\0';
          local_278[0x1c] = '\0';
          local_278[0x1d] = '\0';
          local_278[0x1e] = '\0';
          local_278[0x1f] = '\0';
          local_278[0] = '\0';
          local_278[1] = '\0';
          local_278[2] = '\0';
          local_278[3] = '\0';
          local_278[4] = '\0';
          local_278[5] = '\0';
          local_278[6] = '\0';
          local_278[7] = '\0';
          local_278[8] = '\0';
          local_278[9] = '\0';
          local_278[10] = '\0';
          local_278[0xb] = '\0';
          local_278[0xc] = '\0';
          local_278[0xd] = '\0';
          local_278[0xe] = '\0';
          local_278[0xf] = '\0';
          AutoFile::read(coins_file,(int)local_278,(void *)0x20,(size_t)__nbytes);
          uVar11 = ReadCompactSize<AutoFile>(coins_file,true);
          if (local_810 < uVar11) {
            local_2d8 = local_2c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2d8,
                       "Mismatch in coins count in snapshot metadata and actual snapshot data","");
            local_2b8 = &local_2a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2b8,local_2d8,local_2d0 + (long)local_2d8);
            local_298 = &local_288;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_298,local_2d8,local_2d0 + (long)local_2d8);
            puVar16 = (undefined8 *)
                      ((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>
              .super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar16;
            if (local_2b8 == &local_2a8) {
              *puVar16 = CONCAT71(uStack_2a7,local_2a8);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                   uStack_2a0;
            }
            else {
              *(undefined1 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate> = local_2b8;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10)
                   = CONCAT71(uStack_2a7,local_2a8);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_2b0;
            local_2b0 = 0;
            local_2a8 = 0;
            puVar16 = (undefined8 *)
                      ((long)&(__return_storage_ptr__->m_variant).
                              super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
            *(undefined8 **)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar16;
            if (local_298 == &local_288) {
              *puVar16 = CONCAT71(uStack_287,local_288);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                   uStack_280;
            }
            else {
              *(undefined1 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                   local_298;
              *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30)
                   = CONCAT71(uStack_287,local_288);
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_290
            ;
            local_290 = 0;
            local_288 = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
            local_128[0] = local_2c8[0];
            plVar17 = local_2d8;
            local_2b8 = &local_2a8;
            local_298 = &local_288;
            if (local_2d8 != local_2c8) goto LAB_00b217fb;
            goto LAB_00b21803;
          }
          for (; uVar11 != 0; uVar11 = uVar11 - 1) {
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
            local_308.n = 0xffffffff;
            CTxOut::CTxOut((CTxOut *)local_6a0);
            local_678 = 0;
            uVar12 = ReadCompactSize<AutoFile>(coins_file,true);
            local_308.n = (uint32_t)uVar12;
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_278[0];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_278[1];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_278[2];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_278[3];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_278[4];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_278[5];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_278[6];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_278[7];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = local_278[8];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = local_278[9];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = local_278[10];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = local_278[0xb];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = local_278[0xc];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = local_278[0xd];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = local_278[0xe];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = local_278[0xf];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_278[0x10];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_278[0x11];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_278[0x12];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_278[0x13];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_278[0x14];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_278[0x15];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_278[0x16];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_278[0x17];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = local_278[0x18];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = local_278[0x19];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = local_278[0x1a];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = local_278[0x1b];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = local_278[0x1c];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = local_278[0x1d];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = local_278[0x1e];
            local_308.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = local_278[0x1f];
            local_678 = ReadVarInt<AutoFile,(VarIntMode)0,unsigned_int>(coins_file);
            local_58._M_dataplus._M_p = local_6a0;
            local_78[0].m_object = (CScript *)auStack_698;
            ActionUnserialize::
            SerReadWriteMany<AutoFile,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
                      (coins_file,(Wrapper<AmountCompression,_long_&> *)&local_58,local_78);
            if ((local_7fc < (int)(local_678 >> 1)) || (local_308.n == 0xffffffff)) {
              local_368 = local_358;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_368,"Bad snapshot data after deserializing %d coins","");
              local_5c8._0_8_ = local_5c8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_5c8,local_368,local_360 + (long)local_368);
              local_5a8._M_p = (pointer)local_598;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5a8,local_368,local_360 + (long)local_368);
              local_58._M_dataplus._M_p = (pointer)(local_808 - local_810);
              tinyformat::format<unsigned_long>
                        (&local_348,(bilingual_str *)local_5c8,(unsigned_long *)&local_58);
              puVar16 = (undefined8 *)
                        ((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar16;
              paVar1 = &local_348.original.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348.original._M_dataplus._M_p == paVar1) {
                *puVar16 = CONCAT71(local_348.original.field_2._M_allocated_capacity._1_7_,
                                    local_348.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                     local_348.original.field_2._8_8_;
              }
              else {
                *(pointer *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate> =
                     local_348.original._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10
                          ) = CONCAT71(local_348.original.field_2._M_allocated_capacity._1_7_,
                                       local_348.original.field_2._M_local_buf[0]);
              }
              paVar2 = &local_348.translated.field_2;
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
                   local_348.original._M_string_length;
              puVar16 = (undefined8 *)
                        ((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar16
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348.translated._M_dataplus._M_p == paVar2) {
                *puVar16 = CONCAT71(local_348.translated.field_2._M_allocated_capacity._1_7_,
                                    local_348.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                     local_348.translated.field_2._8_8_;
              }
              else {
                *(pointer *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                     local_348.translated._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30
                          ) = CONCAT71(local_348.translated.field_2._M_allocated_capacity._1_7_,
                                       local_348.translated.field_2._M_local_buf[0]);
              }
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
                   local_348.translated._M_string_length;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
              local_348.translated.field_2._M_local_buf[0] = '\0';
              local_348.translated._M_string_length = 0;
              local_348.original.field_2._M_local_buf[0] = '\0';
              local_348.original._M_string_length = 0;
              local_348.original._M_dataplus._M_p = (pointer)paVar1;
              local_348.translated._M_dataplus._M_p = (pointer)paVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_p != local_598) {
                operator_delete(local_5a8._M_p,local_598[0]._M_allocated_capacity + 1);
              }
              if ((mutex_type *)local_5c8._0_8_ != (mutex_type *)(local_5c8 + 0x10)) {
                operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
              }
              plVar17 = local_368;
              if (local_368 != local_358) {
LAB_00b21d32:
                operator_delete(plVar17,local_358[0] + 1);
              }
LAB_00b21d3a:
              if (0x1c < (uint)auStack_698._28_4_) {
                free((void *)auStack_698._0_8_);
                auStack_698._0_8_ = (char *)0x0;
              }
              goto LAB_00b21803;
            }
            if ((pointer)0x775f05a074000 < (ulong)local_6a0) {
              local_3c8 = local_3b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3c8,
                         "Bad snapshot data after deserializing %d coins - bad tx out value","");
              local_5c8._0_8_ = local_5c8 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_5c8,local_3c8,local_3c0 + (long)local_3c8);
              local_5a8._M_p = (pointer)local_598;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_5a8,local_3c8,local_3c0 + (long)local_3c8);
              local_58._M_dataplus._M_p = (pointer)(local_808 - local_810);
              tinyformat::format<unsigned_long>
                        (&local_3a8,(bilingual_str *)local_5c8,(unsigned_long *)&local_58);
              puVar16 = (undefined8 *)
                        ((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
              *(undefined8 **)
               &(__return_storage_ptr__->m_variant).
                super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar16;
              paVar1 = &local_3a8.original.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8.original._M_dataplus._M_p == paVar1) {
                *puVar16 = CONCAT71(local_3a8.original.field_2._M_allocated_capacity._1_7_,
                                    local_3a8.original.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                     local_3a8.original.field_2._8_8_;
              }
              else {
                *(pointer *)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate> =
                     local_3a8.original._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10
                          ) = CONCAT71(local_3a8.original.field_2._M_allocated_capacity._1_7_,
                                       local_3a8.original.field_2._M_local_buf[0]);
              }
              paVar2 = &local_3a8.translated.field_2;
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
                   local_3a8.original._M_string_length;
              puVar16 = (undefined8 *)
                        ((long)&(__return_storage_ptr__->m_variant).
                                super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
              *(undefined8 **)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar16
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8.translated._M_dataplus._M_p == paVar2) {
                *puVar16 = CONCAT71(local_3a8.translated.field_2._M_allocated_capacity._1_7_,
                                    local_3a8.translated.field_2._M_local_buf[0]);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                     local_3a8.translated.field_2._8_8_;
              }
              else {
                *(pointer *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                     local_3a8.translated._M_dataplus._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30
                          ) = CONCAT71(local_3a8.translated.field_2._M_allocated_capacity._1_7_,
                                       local_3a8.translated.field_2._M_local_buf[0]);
              }
              *(size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
                   local_3a8.translated._M_string_length;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
              local_3a8.translated.field_2._M_local_buf[0] = '\0';
              local_3a8.translated._M_string_length = 0;
              local_3a8.original.field_2._M_local_buf[0] = '\0';
              local_3a8.original._M_string_length = 0;
              local_3a8.original._M_dataplus._M_p = (pointer)paVar1;
              local_3a8.translated._M_dataplus._M_p = (pointer)paVar2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_p != local_598) {
                operator_delete(local_5a8._M_p,local_598[0]._M_allocated_capacity + 1);
              }
              if ((mutex_type *)local_5c8._0_8_ != (mutex_type *)(local_5c8 + 0x10)) {
                operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
              }
              local_358[0] = local_3b8[0];
              plVar17 = local_3c8;
              if (local_3c8 != local_3b8) goto LAB_00b21d32;
              goto LAB_00b21d3a;
            }
            CCoinsViewCache::EmplaceCoinInternalDANGER(this_00,&local_308,(Coin *)local_6a0);
            local_810 = local_810 - 1;
            local_818 = local_818 + 1;
            if ((local_818 * 0x790fb65668c26139 + 0x218def416bd80U >> 6 |
                local_818 * 0x790fb65668c26139 << 0x3a) < 0x10c6f7a0b5ed) {
              local_81c = ((float)local_818 * 100.0) / (float)local_808;
              sVar13 = CCoinsViewCache::DynamicMemoryUsage(this_00);
              local_828 = sVar13 / 1000000;
              pLVar10 = LogInstance();
              bVar6 = BCLog::Logger::Enabled(pLVar10);
              if (bVar6) {
                local_5c8._0_8_ = local_5c8 + 0x10;
                local_5c8._8_8_ = 0;
                local_5c8._16_8_ = local_5c8._16_8_ & 0xffffffffffffff00;
                tinyformat::format<long,float,unsigned_long>
                          (&local_58,(tinyformat *)"[snapshot] %d coins loaded (%.2f%%, %.2f MB)\n",
                           (char *)&local_818,(long *)&local_81c,(float *)&local_828,in_R9);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_5c8,&local_58);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
                pLVar10 = LogInstance();
                local_58._M_dataplus._M_p = (pointer)0x57;
                local_58._M_string_length = 0xffe2b9;
                in_R9 = (unsigned_long *)0x171c;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                ;
                source_file._M_len = 0x57;
                str._M_str = (char *)local_5c8._0_8_;
                str._M_len = local_5c8._8_8_;
                logging_function._M_str = "PopulateAndValidateSnapshot";
                logging_function._M_len = 0x1b;
                BCLog::Logger::LogPrintStr(pLVar10,str,logging_function,source_file,0x171c,ALL,Info)
                ;
                if ((mutex_type *)local_5c8._0_8_ != (mutex_type *)(local_5c8 + 0x10)) {
                  operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
                }
              }
            }
            __nbytes = (pointer)0x8bcf64e5ec10;
            if ((local_818 * -0x647d108541ac2b25 + 0x1179ec9cbd8200U >> 6 |
                local_818 * -0x647d108541ac2b25 << 0x3a) < 0x8bcf64e5ec11) {
              bVar6 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
              if (bVar6) {
                local_428 = local_418;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_428,"Aborting after an interrupt was requested","");
                local_408 = &local_3f8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_408,local_428,local_420 + (long)local_428);
                local_3e8 = &local_3d8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_3e8,local_428,local_420 + (long)local_428);
                puVar16 = (undefined8 *)
                          ((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10
                          );
                *(undefined8 **)
                 &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar16;
                if (local_408 == &local_3f8) {
                  *puVar16 = CONCAT71(uStack_3f7,local_3f8);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
                       uStack_3f0;
                }
                else {
                  *(undefined1 **)
                   &(__return_storage_ptr__->m_variant).
                    super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate> = local_408;
                  *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate> +
                            0x10) = CONCAT71(uStack_3f7,local_3f8);
                }
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
                     local_400;
                puVar16 = (undefined8 *)
                          ((long)&(__return_storage_ptr__->m_variant).
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30
                          );
                *(undefined8 **)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                     puVar16;
                if (local_3e8 == &local_3d8) {
                  *puVar16 = CONCAT71(uStack_3d7,local_3d8);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
                       uStack_3d0;
                }
                else {
                  *(undefined1 **)
                   ((long)&(__return_storage_ptr__->m_variant).
                           super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
                       local_3e8;
                  *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate> +
                            0x30) = CONCAT71(uStack_3d7,local_3d8);
                }
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
                     local_3e0;
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
                local_3d8 = 0;
                local_3e0 = 0;
                local_3f8 = 0;
                local_400 = 0;
                local_358[0] = local_418[0];
                plVar17 = local_428;
                local_408 = &local_3f8;
                local_3e8 = &local_3d8;
                if (local_428 != local_418) goto LAB_00b21d32;
                goto LAB_00b21d3a;
              }
              local_58._M_dataplus._M_p = (pointer)&cs_main;
              local_58._M_string_length = local_58._M_string_length & 0xffffffffffffff00;
              std::unique_lock<std::recursive_mutex>::lock
                        ((unique_lock<std::recursive_mutex> *)&local_58);
              if (snapshot_chainstate->m_mempool == (CTxMemPool *)0x0) {
                sVar13 = 0;
              }
              else {
                sVar13 = (snapshot_chainstate->m_mempool->m_opts).max_size_bytes;
              }
              CVar7 = Chainstate::GetCoinsCacheSizeState
                                (snapshot_chainstate,
                                 snapshot_chainstate->m_coinstip_cache_size_bytes,sVar13);
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)&local_58);
              if (LARGE < CVar7) {
                local_5c8._16_8_ = 0;
                local_5c8._24_8_ = 0;
                local_5c8._0_8_ = (mutex_type *)0x0;
                local_5c8._8_8_ = 0;
                bytes.m_size = 0x20;
                bytes.m_data = (uchar *)local_5c8;
                GetRandBytes(bytes);
                CCoinsViewCache::SetBestBlock(this_00,(uint256 *)local_5c8);
                FlushSnapshotToDisk(this_00,false);
              }
            }
            if (0x1c < (uint)auStack_698._28_4_) {
              free((void *)auStack_698._0_8_);
              auStack_698._0_8_ = (char *)0x0;
            }
          }
        }
        CCoinsViewCache::SetBestBlock(this_00,local_d8);
        AutoFile::read(coins_file,(int)local_78,(void *)0x1,(size_t)__nbytes);
        local_4e8 = local_4d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4e8,
                   "Bad snapshot - coins left over after deserializing %d coins","");
        local_5c8._0_8_ = (mutex_type *)(local_5c8 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5c8,local_4e8,local_4e0 + (long)local_4e8);
        local_5a8._M_p = (pointer)local_598;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5a8,local_4e8,local_4e0 + (long)local_4e8);
        tinyformat::format<unsigned_long>(local_4c8,(bilingual_str *)local_5c8,&local_808);
        puVar16 = (undefined8 *)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar16;
        paVar1 = &local_4c8[0].original.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8[0].original._M_dataplus._M_p == paVar1) {
          *puVar16 = CONCAT71(local_4c8[0].original.field_2._M_allocated_capacity._1_7_,
                              local_4c8[0].original.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
               local_4c8[0].original.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate> =
               local_4c8[0].original._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
               CONCAT71(local_4c8[0].original.field_2._M_allocated_capacity._1_7_,
                        local_4c8[0].original.field_2._M_local_buf[0]);
        }
        paVar2 = &local_4c8[0].translated.field_2;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
             local_4c8[0].original._M_string_length;
        puVar16 = (undefined8 *)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar16;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8[0].translated._M_dataplus._M_p == paVar2) {
          *puVar16 = CONCAT71(local_4c8[0].translated.field_2._M_allocated_capacity._1_7_,
                              local_4c8[0].translated.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
               local_4c8[0].translated.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
               local_4c8[0].translated._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
               CONCAT71(local_4c8[0].translated.field_2._M_allocated_capacity._1_7_,
                        local_4c8[0].translated.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
             local_4c8[0].translated._M_string_length;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
        local_4c8[0].translated.field_2._M_local_buf[0] = '\0';
        local_4c8[0].translated._M_string_length = 0;
        local_4c8[0].original.field_2._M_local_buf[0] = '\0';
        local_4c8[0].original._M_string_length = 0;
        local_4c8[0].original._M_dataplus._M_p = (pointer)paVar1;
        local_4c8[0].translated._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_p != local_598) {
          operator_delete(local_5a8._M_p,local_598[0]._M_allocated_capacity + 1);
        }
        if ((mutex_type *)local_5c8._0_8_ != (mutex_type *)(local_5c8 + 0x10)) {
          operator_delete((void *)local_5c8._0_8_,local_5c8._16_8_ + 1);
        }
        local_128[0] = local_4d8[0];
        plVar17 = local_4e8;
        if (local_4e8 == local_4d8) goto LAB_00b21803;
      }
      else {
        local_250 = local_240;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"Work does not exceed active chainstate","");
        local_230 = &local_220;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,local_250,local_248 + (long)local_250);
        local_210 = &local_200;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_250,local_248 + (long)local_250);
        puVar16 = (undefined8 *)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar16;
        if (local_230 == &local_220) {
          *puVar16 = CONCAT71(uStack_21f,local_220);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) = uStack_218;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate> = local_230;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
               CONCAT71(uStack_21f,local_220);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) = local_228;
        puVar16 = (undefined8 *)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar16;
        if (local_210 == &local_200) {
          *puVar16 = CONCAT71(uStack_1ff,local_200);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) = uStack_1f8;
        }
        else {
          *(undefined1 **)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = local_210;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
               CONCAT71(uStack_1ff,local_200);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) = local_208;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
        local_200 = 0;
        local_208 = 0;
        local_220 = 0;
        local_228 = 0;
        local_128[0] = local_240[0];
        plVar17 = local_250;
        local_230 = &local_220;
        local_210 = &local_200;
        if (local_250 == local_240) goto LAB_00b21803;
      }
    }
  }
LAB_00b217fb:
  operator_delete(plVar17,local_128[0] + 1);
LAB_00b21803:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ChainstateManager::PopulateAndValidateSnapshot(
    Chainstate& snapshot_chainstate,
    AutoFile& coins_file,
    const SnapshotMetadata& metadata)
{
    // It's okay to release cs_main before we're done using `coins_cache` because we know
    // that nothing else will be referencing the newly created snapshot_chainstate yet.
    CCoinsViewCache& coins_cache = *WITH_LOCK(::cs_main, return &snapshot_chainstate.CoinsTip());

    uint256 base_blockhash = metadata.m_base_blockhash;

    CBlockIndex* snapshot_start_block = WITH_LOCK(::cs_main, return m_blockman.LookupBlockIndex(base_blockhash));

    if (!snapshot_start_block) {
        // Needed for ComputeUTXOStats to determine the
        // height and to avoid a crash when base_blockhash.IsNull()
        return util::Error{strprintf(Untranslated("Did not find snapshot start blockheader %s"),
                  base_blockhash.ToString())};
    }

    int base_height = snapshot_start_block->nHeight;
    const auto& maybe_au_data = GetParams().AssumeutxoForHeight(base_height);

    if (!maybe_au_data) {
        return util::Error{strprintf(Untranslated("Assumeutxo height in snapshot metadata not recognized "
                  "(%d) - refusing to load snapshot"), base_height)};
    }

    const AssumeutxoData& au_data = *maybe_au_data;

    // This work comparison is a duplicate check with the one performed later in
    // ActivateSnapshot(), but is done so that we avoid doing the long work of staging
    // a snapshot that isn't actually usable.
    if (WITH_LOCK(::cs_main, return !CBlockIndexWorkComparator()(ActiveTip(), snapshot_start_block))) {
        return util::Error{Untranslated("Work does not exceed active chainstate")};
    }

    const uint64_t coins_count = metadata.m_coins_count;
    uint64_t coins_left = metadata.m_coins_count;

    LogPrintf("[snapshot] loading %d coins from snapshot %s\n", coins_left, base_blockhash.ToString());
    int64_t coins_processed{0};

    while (coins_left > 0) {
        try {
            Txid txid;
            coins_file >> txid;
            size_t coins_per_txid{0};
            coins_per_txid = ReadCompactSize(coins_file);

            if (coins_per_txid > coins_left) {
                return util::Error{Untranslated("Mismatch in coins count in snapshot metadata and actual snapshot data")};
            }

            for (size_t i = 0; i < coins_per_txid; i++) {
                COutPoint outpoint;
                Coin coin;
                outpoint.n = static_cast<uint32_t>(ReadCompactSize(coins_file));
                outpoint.hash = txid;
                coins_file >> coin;
                if (coin.nHeight > base_height ||
                    outpoint.n >= std::numeric_limits<decltype(outpoint.n)>::max() // Avoid integer wrap-around in coinstats.cpp:ApplyHash
                ) {
                    return util::Error{strprintf(Untranslated("Bad snapshot data after deserializing %d coins"),
                              coins_count - coins_left)};
                }
                if (!MoneyRange(coin.out.nValue)) {
                    return util::Error{strprintf(Untranslated("Bad snapshot data after deserializing %d coins - bad tx out value"),
                              coins_count - coins_left)};
                }
                coins_cache.EmplaceCoinInternalDANGER(std::move(outpoint), std::move(coin));

                --coins_left;
                ++coins_processed;

                if (coins_processed % 1000000 == 0) {
                    LogPrintf("[snapshot] %d coins loaded (%.2f%%, %.2f MB)\n",
                        coins_processed,
                        static_cast<float>(coins_processed) * 100 / static_cast<float>(coins_count),
                        coins_cache.DynamicMemoryUsage() / (1000 * 1000));
                }

                // Batch write and flush (if we need to) every so often.
                //
                // If our average Coin size is roughly 41 bytes, checking every 120,000 coins
                // means <5MB of memory imprecision.
                if (coins_processed % 120000 == 0) {
                    if (m_interrupt) {
                        return util::Error{Untranslated("Aborting after an interrupt was requested")};
                    }

                    const auto snapshot_cache_state = WITH_LOCK(::cs_main,
                        return snapshot_chainstate.GetCoinsCacheSizeState());

                    if (snapshot_cache_state >= CoinsCacheSizeState::CRITICAL) {
                        // This is a hack - we don't know what the actual best block is, but that
                        // doesn't matter for the purposes of flushing the cache here. We'll set this
                        // to its correct value (`base_blockhash`) below after the coins are loaded.
                        coins_cache.SetBestBlock(GetRandHash());

                        // No need to acquire cs_main since this chainstate isn't being used yet.
                        FlushSnapshotToDisk(coins_cache, /*snapshot_loaded=*/false);
                    }
                }
            }
        } catch (const std::ios_base::failure&) {
            return util::Error{strprintf(Untranslated("Bad snapshot format or truncated snapshot after deserializing %d coins"),
                      coins_processed)};
        }
    }

    // Important that we set this. This and the coins_cache accesses above are
    // sort of a layer violation, but either we reach into the innards of
    // CCoinsViewCache here or we have to invert some of the Chainstate to
    // embed them in a snapshot-activation-specific CCoinsViewCache bulk load
    // method.
    coins_cache.SetBestBlock(base_blockhash);

    bool out_of_coins{false};
    try {
        std::byte left_over_byte;
        coins_file >> left_over_byte;
    } catch (const std::ios_base::failure&) {
        // We expect an exception since we should be out of coins.
        out_of_coins = true;
    }
    if (!out_of_coins) {
        return util::Error{strprintf(Untranslated("Bad snapshot - coins left over after deserializing %d coins"),
            coins_count)};
    }

    LogPrintf("[snapshot] loaded %d (%.2f MB) coins from snapshot %s\n",
        coins_count,
        coins_cache.DynamicMemoryUsage() / (1000 * 1000),
        base_blockhash.ToString());

    // No need to acquire cs_main since this chainstate isn't being used yet.
    FlushSnapshotToDisk(coins_cache, /*snapshot_loaded=*/true);

    assert(coins_cache.GetBestBlock() == base_blockhash);

    // As above, okay to immediately release cs_main here since no other context knows
    // about the snapshot_chainstate.
    CCoinsViewDB* snapshot_coinsdb = WITH_LOCK(::cs_main, return &snapshot_chainstate.CoinsDB());

    std::optional<CCoinsStats> maybe_stats;

    try {
        maybe_stats = ComputeUTXOStats(
            CoinStatsHashType::HASH_SERIALIZED, snapshot_coinsdb, m_blockman, [&interrupt = m_interrupt] { SnapshotUTXOHashBreakpoint(interrupt); });
    } catch (StopHashingException const&) {
        return util::Error{Untranslated("Aborting after an interrupt was requested")};
    }
    if (!maybe_stats.has_value()) {
        return util::Error{Untranslated("Failed to generate coins stats")};
    }

    // Assert that the deserialized chainstate contents match the expected assumeutxo value.
    if (AssumeutxoHash{maybe_stats->hashSerialized} != au_data.hash_serialized) {
        return util::Error{strprintf(Untranslated("Bad snapshot content hash: expected %s, got %s"),
            au_data.hash_serialized.ToString(), maybe_stats->hashSerialized.ToString())};
    }

    snapshot_chainstate.m_chain.SetTip(*snapshot_start_block);

    // The remainder of this function requires modifying data protected by cs_main.
    LOCK(::cs_main);

    // Fake various pieces of CBlockIndex state:
    CBlockIndex* index = nullptr;

    // Don't make any modifications to the genesis block since it shouldn't be
    // necessary, and since the genesis block doesn't have normal flags like
    // BLOCK_VALID_SCRIPTS set.
    constexpr int AFTER_GENESIS_START{1};

    for (int i = AFTER_GENESIS_START; i <= snapshot_chainstate.m_chain.Height(); ++i) {
        index = snapshot_chainstate.m_chain[i];

        // Fake BLOCK_OPT_WITNESS so that Chainstate::NeedsRedownload()
        // won't ask to rewind the entire assumed-valid chain on startup.
        if (DeploymentActiveAt(*index, *this, Consensus::DEPLOYMENT_SEGWIT)) {
            index->nStatus |= BLOCK_OPT_WITNESS;
        }

        m_blockman.m_dirty_blockindex.insert(index);
        // Changes to the block index will be flushed to disk after this call
        // returns in `ActivateSnapshot()`, when `MaybeRebalanceCaches()` is
        // called, since we've added a snapshot chainstate and therefore will
        // have to downsize the IBD chainstate, which will result in a call to
        // `FlushStateToDisk(ALWAYS)`.
    }

    assert(index);
    assert(index == snapshot_start_block);
    index->m_chain_tx_count = au_data.m_chain_tx_count;
    snapshot_chainstate.setBlockIndexCandidates.insert(snapshot_start_block);

    LogPrintf("[snapshot] validated snapshot (%.2f MB)\n",
        coins_cache.DynamicMemoryUsage() / (1000 * 1000));
    return {};
}